

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ThrowTypeErrorReadOnly(JSContext *ctx,int flags,JSAtom atom)

{
  JSStackFrame *pJVar1;
  
  if (((uint)flags >> 0xe & 1) == 0) {
    if (-1 < (short)flags) {
      return 0;
    }
    pJVar1 = ctx->rt->current_stack_frame;
    if (pJVar1 == (JSStackFrame *)0x0) {
      return 0;
    }
    if ((pJVar1->js_mode & 1) == 0) {
      return 0;
    }
  }
  __JS_ThrowTypeErrorAtom(ctx,atom,"\'%s\' is read-only");
  return -1;
}

Assistant:

static int JS_ThrowTypeErrorReadOnly(JSContext *ctx, int flags, JSAtom atom)
{
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeErrorAtom(ctx, "'%s' is read-only", atom);
        return -1;
    } else {
        return FALSE;
    }
}